

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

void __thiscall musicBlock::OPLreleaseNote(musicBlock *this,uint channel,uchar note)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  
  bVar1 = (this->driverdata).channelSustain[channel];
  puVar2 = &this->channels[0].flags;
  for (uVar3 = 0; uVar3 < this->io->OPLchannels; uVar3 = uVar3 + 1) {
    if ((((channelEntry *)(puVar2 + -2))->channel == channel) && (puVar2[-1] == note)) {
      if (bVar1 < 0x40) {
        releaseChannel(this,(uint)uVar3,0);
      }
      else {
        *puVar2 = *puVar2 | 2;
      }
    }
    puVar2 = puVar2 + 0x28;
  }
  return;
}

Assistant:

void musicBlock::OPLreleaseNote(uint channel, uchar note)
{
	uint i;
	uint id = channel;
	uint sustain = driverdata.channelSustain[channel];

	for(i = 0; i < io->OPLchannels; i++)
	{
		if (channels[i].channel == id && channels[i].note == note)
		{
			if (sustain < 0x40)
				releaseChannel(i, 0);
			else
				channels[i].flags |= CH_SUSTAIN;
		}
	}
}